

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.h
# Opt level: O2

Node __thiscall trieste::Parse::parse_source(Parse *this,string *name,Token *token,Source *source)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>_>_>
  *this_00;
  _Base_ptr p_Var1;
  bool bVar2;
  __type_conflict _Var3;
  const_iterator cVar4;
  runtime_error *prVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Source *in_R8;
  _Base_ptr p_Var6;
  Node NVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> mode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  Make make;
  
  if ((in_R8->super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    *(undefined8 *)this = 0;
    this->wf_ = (Wellformed *)0x0;
  }
  else {
    detail::Make::Make(&make,(string *)token,(Token *)source,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&mode,"start",(allocator<char> *)&local_e8);
    this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>_>_>
               *)((long)&name[7].field_2 + 8);
    cVar4 = CLI::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>_>_>
            ::find(this_00,&mode);
    std::__cxx11::string::~string((string *)&mode);
    if (cVar4._M_node == (_Base_ptr)(name + 8)) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"unknown mode: start");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&make.mode_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (cVar4._M_node + 1));
    std::__cxx11::string::string((string *)&mode,&make.mode_);
LAB_0014e10a:
    if (make.re_iterator.sp.size_ != 0) {
      p_Var1 = cVar4._M_node[2]._M_parent;
      for (p_Var6 = *(_Base_ptr *)(cVar4._M_node + 2); p_Var6 != p_Var1;
          p_Var6 = (_Base_ptr)&p_Var6->_M_left) {
        bVar2 = REIterator::consume(&make.re_iterator,*(RE2 **)p_Var6,&make.re_match);
        if (bVar2) {
          CLI::std::function<void_(trieste::detail::Make_&)>::operator()
                    ((function<void_(trieste::detail::Make_&)> *)(*(long *)p_Var6 + 0x98),&make);
          _Var3 = std::operator==(&make.mode_,&mode);
          if (!_Var3) {
            cVar4 = CLI::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>_>_>
                    ::find(this_00,&make.mode_);
            if (cVar4._M_node == (_Base_ptr)(name + 8)) {
              prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::operator+(&local_e8,"unknown mode: ",&make.mode_);
              std::runtime_error::runtime_error(prVar5,(string *)&local_e8);
              __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign(&mode,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (cVar4._M_node + 1));
          }
          goto LAB_0014e10a;
        }
      }
      detail::Make::invalid(&make);
      make.re_iterator.sp.data_ = make.re_iterator.sp.data_ + 1;
      make.re_iterator.sp.size_ = make.re_iterator.sp.size_ - 1;
      goto LAB_0014e10a;
    }
    if (name[7]._M_string_length != 0) {
      CLI::std::function<void_(trieste::detail::Make_&)>::operator()
                ((function<void_(trieste::detail::Make_&)> *)((long)&name[6].field_2 + 8),&make);
    }
    detail::Make::done((Make *)this);
    std::__cxx11::string::~string((string *)&mode);
    detail::Make::~Make(&make);
    token = (Token *)extraout_RDX;
  }
  NVar7.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)token;
  NVar7.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Node)NVar7.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node parse_source(
      const std::string name, const Token& token, const Source& source) const
    {
      if (!source)
        return {};

      auto make = detail::Make(name, token, source);

      // Find the start rules.
      auto find = rules.find("start");
      if (find == rules.end())
        throw std::runtime_error("unknown mode: start");

      auto mode = make.mode_ = find->first;

      while (!make.re_iterator.empty())
      {
        bool matched = false;

        for (auto& rule : find->second)
        {
          matched = make.re_iterator.consume(rule->regex, make.re_match);

          if (matched)
          {
            rule->effect(make);

            if (make.mode_ != mode)
            {
              find = rules.find(make.mode_);
              if (find == rules.end())
                throw std::runtime_error("unknown mode: " + make.mode_);

              mode = find->first;
            }
            break;
          }
        }

        if (!matched)
        {
          make.invalid();
          make.re_iterator.skip();
        }
      }

      if (done_)
        done_(make);

      return make.done();
    }